

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall gmath::Camera::Camera(Camera *this,Properties *prop,int id)

{
  double *value;
  Camera *this_00;
  _Alloc_hider _Var1;
  string local_50;
  
  this->_vptr_Camera = (_func_int **)&PTR__Camera_00173850;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this_00 = (Camera *)prop;
  SMatrix<double,_3,_3>::SMatrix(&this->R);
  SVector<double,_3>::SVector(&this->T);
  (this->match).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->match).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->match).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getCameraKey_abi_cxx11_(&local_50,this_00,"R",id);
  _Var1._M_p = local_50._M_dataplus._M_p;
  gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
            (prop,local_50._M_dataplus._M_p,&this->R,"[1 0 0; 0 1 0; 0 0 1]");
  std::__cxx11::string::~string((string *)&local_50);
  getCameraKey_abi_cxx11_(&local_50,(Camera *)_Var1._M_p,"T",id);
  _Var1._M_p = local_50._M_dataplus._M_p;
  gutil::Properties::getValue<gmath::SVector<double,3>>
            (prop,local_50._M_dataplus._M_p,&this->T,"[0 0 0]");
  std::__cxx11::string::~string((string *)&local_50);
  getCameraKey_abi_cxx11_(&local_50,(Camera *)_Var1._M_p,"width",id);
  _Var1._M_p = local_50._M_dataplus._M_p;
  gutil::Properties::getValue<long>(prop,local_50._M_dataplus._M_p,&this->width,"0");
  std::__cxx11::string::~string((string *)&local_50);
  getCameraKey_abi_cxx11_(&local_50,(Camera *)_Var1._M_p,"height",id);
  _Var1._M_p = local_50._M_dataplus._M_p;
  gutil::Properties::getValue<long>(prop,local_50._M_dataplus._M_p,&this->height,"0");
  std::__cxx11::string::~string((string *)&local_50);
  getCameraKey_abi_cxx11_(&local_50,(Camera *)_Var1._M_p,"zmin",id);
  _Var1._M_p = local_50._M_dataplus._M_p;
  gutil::Properties::getValue<double>(prop,local_50._M_dataplus._M_p,&this->zmin,"0");
  std::__cxx11::string::~string((string *)&local_50);
  getCameraKey_abi_cxx11_(&local_50,(Camera *)_Var1._M_p,"zmax",id);
  value = &this->zmax;
  _Var1._M_p = local_50._M_dataplus._M_p;
  gutil::Properties::getValue<double>(prop,local_50._M_dataplus._M_p,value,"-1");
  std::__cxx11::string::~string((string *)&local_50);
  if (*value <= 0.0 && *value != 0.0) {
    *value = 1.79769313486232e+308;
  }
  getCameraKey_abi_cxx11_(&local_50,(Camera *)_Var1._M_p,"match",id);
  gutil::Properties::getStringVector(prop,local_50._M_dataplus._M_p,&this->match,"",',');
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Camera::Camera(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("R", id).c_str(), R, "[1 0 0; 0 1 0; 0 0 1]");
  prop.getValue(getCameraKey("T", id).c_str(), T, "[0 0 0]");
  prop.getValue(getCameraKey("width", id).c_str(), width, "0");
  prop.getValue(getCameraKey("height", id).c_str(), height, "0");

  prop.getValue(getCameraKey("zmin", id).c_str(), zmin, "0");
  prop.getValue(getCameraKey("zmax", id).c_str(), zmax, "-1");

  if (zmax < 0)
  {
    zmax=std::numeric_limits<double>::max();
  }

  prop.getStringVector(getCameraKey("match", id).c_str(), match, "", ',');
}